

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

void __thiscall
LoopCrosser::LoopCrosser(LoopCrosser *this,S2Loop *a,S2Loop *b,LoopRelation *relation,bool swapped)

{
  long lVar2;
  int iVar3;
  ulong uVar1;
  
  this->a_ = a;
  this->b_ = b;
  this->relation_ = relation;
  this->swapped_ = swapped;
  iVar3 = (*relation->_vptr_LoopRelation[2])(relation);
  this->a_crossing_target_ = iVar3;
  iVar3 = (*relation->_vptr_LoopRelation[3])(relation);
  this->b_crossing_target_ = iVar3;
  (this->crosser_).a_cross_b_.c_[0] = 0.0;
  (this->crosser_).a_cross_b_.c_[1] = 0.0;
  (this->crosser_).a_cross_b_.c_[2] = 0.0;
  (this->crosser_).a_tangent_.c_[0] = 0.0;
  (this->crosser_).a_tangent_.c_[1] = 0.0;
  (this->crosser_).a_tangent_.c_[2] = 0.0;
  (this->crosser_).b_tangent_.c_[0] = 0.0;
  (this->crosser_).b_tangent_.c_[1] = 0.0;
  (this->crosser_).b_tangent_.c_[2] = 0.0;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_query_).tmp_candidates_.
  super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->b_query_).index_ = (S2ShapeIndex *)0x0;
  (this->b_query_).a0_.c_[0] = 0.0;
  (this->b_query_).a0_.c_[1] = 0.0;
  (this->b_query_).a1_.c_[0] = 0.0;
  (this->b_query_).a1_.c_[1] = 0.0;
  (this->b_query_).iter_.iter_._M_t.
  super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
  .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl = (IteratorBase *)0x0;
  S2CrossingEdgeQuery::Init(&this->b_query_,&(b->index_).super_S2ShapeIndex);
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->b_cells_).
  super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (swapped) {
    lVar2._0_4_ = this->a_crossing_target_;
    lVar2._4_4_ = this->b_crossing_target_;
    uVar1._0_4_ = this->a_crossing_target_;
    uVar1._4_4_ = this->b_crossing_target_;
    uVar1 = lVar2 << 0x20 | uVar1 >> 0x20;
    this->a_crossing_target_ = (int)uVar1;
    this->b_crossing_target_ = (int)(uVar1 >> 0x20);
  }
  return;
}

Assistant:

LoopCrosser(const S2Loop& a, const S2Loop& b,
              LoopRelation* relation, bool swapped)
      : a_(a), b_(b), relation_(relation), swapped_(swapped),
        a_crossing_target_(relation->a_crossing_target()),
        b_crossing_target_(relation->b_crossing_target()),
        b_query_(&b.index_) {
    using std::swap;
    if (swapped) swap(a_crossing_target_, b_crossing_target_);
  }